

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amrex_parser.lex.cpp
# Opt level: O0

YY_BUFFER_STATE amrex_parser_scan_buffer(char *base,yy_size_t size)

{
  ulong in_RSI;
  char *in_RDI;
  YY_BUFFER_STATE b;
  YY_BUFFER_STATE local_8;
  
  if (((in_RSI < 2) || (in_RDI[in_RSI - 2] != '\0')) || (in_RDI[in_RSI - 1] != '\0')) {
    local_8 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_8 = (YY_BUFFER_STATE)amrex_parseralloc(0x162b32c);
    if (local_8 == (YY_BUFFER_STATE)0x0) {
      yy_fatal_error((char *)0x162b345);
    }
    local_8->yy_buf_size = (int)in_RSI + -2;
    local_8->yy_ch_buf = in_RDI;
    local_8->yy_buf_pos = in_RDI;
    local_8->yy_is_our_buffer = 0;
    local_8->yy_input_file = (FILE *)0x0;
    local_8->yy_n_chars = local_8->yy_buf_size;
    local_8->yy_is_interactive = 0;
    local_8->yy_at_bol = 1;
    local_8->yy_fill_buffer = 0;
    local_8->yy_buffer_status = 0;
    amrex_parser_switch_to_buffer(local_8);
  }
  return local_8;
}

Assistant:

YY_BUFFER_STATE yy_scan_buffer  (char * base, yy_size_t  size )
{
	YY_BUFFER_STATE b;
    
	if ( size < 2 ||
	     base[size-2] != YY_END_OF_BUFFER_CHAR ||
	     base[size-1] != YY_END_OF_BUFFER_CHAR )
		/* They forgot to leave room for the EOB's. */
		return NULL;

	b = (YY_BUFFER_STATE) yyalloc( sizeof( struct yy_buffer_state )  );
	if ( ! b )
		YY_FATAL_ERROR( "out of dynamic memory in yy_scan_buffer()" );

	b->yy_buf_size = (int) (size - 2);	/* "- 2" to take care of EOB's */
	b->yy_buf_pos = b->yy_ch_buf = base;
	b->yy_is_our_buffer = 0;
	b->yy_input_file = NULL;
	b->yy_n_chars = b->yy_buf_size;
	b->yy_is_interactive = 0;
	b->yy_at_bol = 1;
	b->yy_fill_buffer = 0;
	b->yy_buffer_status = YY_BUFFER_NEW;

	yy_switch_to_buffer( b  );

	return b;
}